

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseUnqualifiedName(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined8 uVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  char *pcVar16;
  State copy;
  
  bVar12 = ParseOperatorName(state);
  if (bVar12) {
    return true;
  }
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  uVar6 = state->prev_name_length;
  uVar7 = state->nest_level;
  uVar8 = state->append;
  uVar9 = state->overflowed;
  pcVar16 = state->mangled_cur;
  if ((*pcVar16 == 'C') && (state->mangled_cur = pcVar16 + 1, (byte)(pcVar16[1] - 0x31U) < 3)) {
    state->mangled_cur = pcVar16 + 2;
    pcVar16 = state->prev_name;
    iVar15 = state->prev_name_length;
  }
  else {
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    pcVar16 = state->mangled_cur;
    if ((*pcVar16 != 'D') || (state->mangled_cur = pcVar16 + 1, 2 < (byte)(pcVar16[1] - 0x30U))) {
      state->out_begin = pcVar3;
      state->out_end = pcVar4;
      state->prev_name = pcVar5;
      state->prev_name_length = uVar6;
      state->nest_level = uVar7;
      state->append = (bool)uVar8;
      state->overflowed = (bool)uVar9;
      state->mangled_cur = pcVar1;
      state->out_cur = pcVar2;
      state->out_begin = pcVar3;
      state->out_end = pcVar4;
      bVar12 = ParseSourceName(state);
      if (bVar12) {
LAB_00121f3b:
        pcVar16 = state->mangled_cur;
        pcVar1 = state->out_cur;
        pcVar2 = state->out_begin;
        pcVar3 = state->out_end;
        uVar10 = *(undefined8 *)((long)&state->prev_name + 6);
        copy.out_end._0_6_ = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10)
        ;
        copy.mangled_cur._6_2_ = (undefined2)((ulong)pcVar1 >> 0x30);
        copy.out_cur._0_6_ = SUB86(pcVar2,0);
        copy.out_cur._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
        copy.out_begin._0_6_ = SUB86(pcVar3,0);
        copy.out_begin._6_2_ = (undefined2)((ulong)pcVar3 >> 0x30);
        bVar12 = state->append;
        bVar14 = state->overflowed;
        state->append = false;
        if (*state->mangled_cur == 'B') {
          state->mangled_cur = state->mangled_cur + 1;
          bVar13 = ParseSourceName(state);
          if (bVar13) {
            do {
              if (*state->mangled_cur != 'B') break;
              state->mangled_cur = state->mangled_cur + 1;
              bVar14 = ParseSourceName(state);
            } while (bVar14);
            state->append = (bool)(bVar12 & 1);
            return true;
          }
        }
        *(ulong *)((long)&state->out_cur + 6) = CONCAT62(copy.out_cur._0_6_,copy.mangled_cur._6_2_);
        *(ulong *)((long)&state->out_begin + 6) = CONCAT62(copy.out_begin._0_6_,copy.out_cur._6_2_);
        *(ulong *)((long)&state->out_end + 6) = CONCAT62(copy.out_end._0_6_,copy.out_begin._6_2_);
        *(undefined8 *)((long)&state->prev_name + 6) = uVar10;
        state->mangled_cur = pcVar16;
        state->out_cur = pcVar1;
        state->out_begin = pcVar2;
        state->out_end = pcVar3;
        state->append = bVar12;
        state->overflowed = bVar14;
        return true;
      }
      pcVar16 = state->mangled_cur;
      pcVar1 = state->out_cur;
      pcVar2 = state->out_begin;
      pcVar3 = state->out_end;
      pcVar4 = state->prev_name;
      iVar15 = state->prev_name_length;
      sVar11 = state->nest_level;
      bVar12 = state->append;
      bVar14 = state->overflowed;
      if (*state->mangled_cur == 'L') {
        state->mangled_cur = state->mangled_cur + 1;
        bVar13 = ParseSourceName(state);
        if (bVar13) {
          ParseDiscriminator(state);
          goto LAB_00121f3b;
        }
      }
      state->out_begin = pcVar2;
      state->out_end = pcVar3;
      state->prev_name = pcVar4;
      state->prev_name_length = iVar15;
      state->nest_level = sVar11;
      state->append = bVar12;
      state->overflowed = bVar14;
      state->mangled_cur = pcVar16;
      state->out_cur = pcVar1;
      state->out_begin = pcVar2;
      state->out_end = pcVar3;
      return false;
    }
    state->mangled_cur = pcVar16 + 2;
    pcVar16 = state->prev_name;
    iVar15 = state->prev_name_length;
    MaybeAppend(state,"~");
  }
  MaybeAppendWithLength(state,pcVar16,iVar15);
  return true;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  return (ParseOperatorName(state) ||
          ParseCtorDtorName(state) ||
          (ParseSourceName(state) && Optional(ParseAbiTags(state))) ||
          (ParseLocalSourceName(state) && Optional(ParseAbiTags(state))));
}